

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_fragment.cpp
# Opt level: O0

ON_3dVector * __thiscall
ON_SubDMeshFragment::CenterNormal(ON_3dVector *__return_storage_ptr__,ON_SubDMeshFragment *this)

{
  undefined1 local_28 [4];
  uint i;
  ON_3dVector N;
  ON_SubDMeshFragment *this_local;
  
  if (((this->m_N == (double *)0x0) ||
      (((this->m_N_stride != 0 && (this->m_N_stride < 3)) ||
       ((this->m_grid).m_side_segment_count == '\0')))) || ((this->m_grid).m_S == (uint *)0x0)) {
    __return_storage_ptr__->x = ON_3dVector::NanVector.x;
    __return_storage_ptr__->y = ON_3dVector::NanVector.y;
    __return_storage_ptr__->z = ON_3dVector::NanVector.z;
  }
  else {
    N.z = (double)this;
    if ((this->m_grid).m_side_segment_count == '\x01') {
      ON_3dVector::ON_3dVector
                ((ON_3dVector *)local_28,
                 *this->m_N + this->m_N[this->m_N_stride] + this->m_N[this->m_N_stride * 2] +
                 this->m_N[this->m_N_stride * 3],
                 this->m_N[1] + this->m_N[this->m_N_stride + 1] +
                 this->m_N[this->m_N_stride * 2 + 1] + this->m_N[this->m_N_stride * 3 + 1],
                 this->m_N[2] + this->m_N[this->m_N_stride + 2] +
                 this->m_N[this->m_N_stride * 2 + 2] + this->m_N[this->m_N_stride * 3 + 2]);
      ON_3dVector::UnitVector(__return_storage_ptr__,(ON_3dVector *)local_28);
    }
    else {
      ON_3dVector::ON_3dVector
                (__return_storage_ptr__,
                 this->m_N +
                 (ulong)(((uint)(this->m_grid).m_side_segment_count *
                         ((this->m_grid).m_side_segment_count + 2)) / 2) * this->m_N_stride);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_3dVector ON_SubDMeshFragment::CenterNormal() const
{
  if (nullptr == m_N || (m_N_stride != 0 && m_N_stride < 3) || m_grid.m_side_segment_count <= 0 || nullptr == m_grid.m_S)
    return ON_3dVector::NanVector;

  if (1 == m_grid.m_side_segment_count)
  {
    const ON_3dVector N(
      (m_N[0] + m_N[m_N_stride] + m_N[2 * m_N_stride] + m_N[3 * m_N_stride]),
      (m_N[1] + m_N[1 + m_N_stride] + m_N[1 + 2 * m_N_stride] + m_N[1 + 3 * m_N_stride]),
      (m_N[2] + m_N[2 + m_N_stride] + m_N[2 + 2 * m_N_stride] + m_N[2 + 3 * m_N_stride])
    );
    return N.UnitVector();
  }

  const unsigned int i = (m_grid.m_side_segment_count*(m_grid.m_side_segment_count + 2)) / 2;

  return ON_3dVector(m_N + (i*m_N_stride));
}